

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O2

void mxx::impl::
     bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,long end,long param_3,int param_4,int param_5)

{
  pair<int,_int> *ppVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  ulong uVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var5;
  pair<int,_int> *ppVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  int iVar9;
  long lVar10;
  ulong __n;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> merge_buf;
  datatype dt;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> recv_buf;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  datatype local_60;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  end = end - (long)begin._M_current;
  __n = end >> 3;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,__n,
             (allocator_type *)&local_78);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78,__n,
             (allocator_type *)&local_60);
  local_60.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
  local_60._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
  local_60.builtin = false;
  MPI_Sendrecv(begin._M_current,__n & 0xffffffff,local_60.mpitype,param_4,0,
               local_48._M_impl.super__Vector_impl_data._M_start,(int)__n,local_60.mpitype,param_4,0
               ,*(undefined8 *)(param_3 + 8),0);
  if (param_5 == 1) {
    if (*(int *)(param_3 + 0x14) <= param_4) goto LAB_0012a576;
  }
  else if ((param_5 != 0) || (param_4 <= *(int *)(param_3 + 0x14))) {
LAB_0012a576:
    puVar2 = (undefined4 *)((long)begin._M_current + end + -8);
    puVar7 = (undefined4 *)((long)local_48._M_impl.super__Vector_impl_data._M_start + end + -8);
    for (lVar10 = 0; -lVar10 != __n; lVar10 = lVar10 + -1) {
      iVar9 = puVar2[1];
      if (iVar9 < (int)puVar7[1]) {
        puVar3 = puVar2;
        puVar8 = puVar7 + -2;
        puVar2 = puVar7;
        iVar9 = puVar7[1];
      }
      else {
        puVar3 = puVar2 + -2;
        puVar8 = puVar7;
      }
      *(undefined4 *)
       ((long)local_78._M_impl.super__Vector_impl_data._M_start + lVar10 * 8 + end + -8) = *puVar2;
      *(int *)((long)local_78._M_impl.super__Vector_impl_data._M_start + lVar10 * 8 + end + -4) =
           iVar9;
      puVar2 = puVar3;
      puVar7 = puVar8;
    }
    goto LAB_0012a5d3;
  }
  _Var5._M_current = begin._M_current;
  for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
    iVar9 = (local_48._M_impl.super__Vector_impl_data._M_start)->second;
    if ((_Var5._M_current)->second < iVar9) {
      ppVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = _Var5._M_current + 1;
      local_48._M_impl.super__Vector_impl_data._M_start = _Var5._M_current;
      iVar9 = (_Var5._M_current)->second;
    }
    else {
      ppVar1 = local_48._M_impl.super__Vector_impl_data._M_start + 1;
      ppVar6 = _Var5._M_current;
    }
    local_78._M_impl.super__Vector_impl_data._M_start[uVar4].first =
         (local_48._M_impl.super__Vector_impl_data._M_start)->first;
    local_78._M_impl.super__Vector_impl_data._M_start[uVar4].second = iVar9;
    local_48._M_impl.super__Vector_impl_data._M_start = ppVar1;
    _Var5._M_current = ppVar6;
  }
LAB_0012a5d3:
  std::
  __copy_move_a<false,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )local_78._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )local_78._M_impl.super__Vector_impl_data._M_finish,begin);
  datatype::~datatype(&local_60);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_78);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void bitonic_split(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int partner, int dir) {
    typedef typename std::iterator_traits<_Iterator>::value_type T;
    size_t np = std::distance(begin, end);
    //std::cout << "[Rank " << comm.rank() << "]: split with partner= " << partner << ", dir=" << dir << std::endl;
    std::vector<T> recv_buf(np);
    std::vector<T> merge_buf(np);

    // send/recv
    mxx::datatype dt = mxx::get_datatype<T>();
    MPI_Sendrecv(&*begin, np, dt.type(), partner, 0,
                 &recv_buf[0], np, dt.type(), partner, 0, comm, MPI_STATUS_IGNORE);

    // merge in `dir` direction into merge buffer
    if ((dir == asc && partner > comm.rank()) || (dir == desc && partner < comm.rank())) {
        // forward merge and keep the `np` smaller elements
        _Iterator l = begin;
        typename std::vector<T>::iterator r = recv_buf.begin();
        typename std::vector<T>::iterator o = merge_buf.begin();

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *l;
                ++o;
                ++l;
            } else {
                *o = *r;
                ++o;
                ++r;
            }
        }
    } else {
        // backward merge and keep the `np` larger elements
        _Iterator l = begin+np-1;
        typename std::vector<T>::iterator r = recv_buf.begin()+np-1;
        typename std::vector<T>::iterator o = merge_buf.begin()+np-1;

        for (size_t i = 0; i < np; ++i) {
            if (comp(*l, *r)) {
                *o = *r;
                --o;
                --r;
            } else {
                *o = *l;
                --o;
                --l;
            }
        }
    }
    // copy results into local buffer
    std::copy(merge_buf.begin(), merge_buf.end(), begin);
}